

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sec.c
# Opt level: O2

void duckdb_je_sec_stats_merge(tsdn_t *tsdn,sec_t *sec,sec_stats_t *stats)

{
  sec_shard_t *psVar1;
  size_t i;
  ulong uVar2;
  long lVar3;
  long lVar4;
  
  lVar3 = 0;
  lVar4 = 0;
  for (uVar2 = 0; uVar2 < (sec->opts).nshards; uVar2 = uVar2 + 1) {
    malloc_mutex_lock(tsdn,(malloc_mutex_t *)((long)&(sec->shards->mtx).field_0 + lVar3));
    psVar1 = sec->shards;
    lVar4 = lVar4 + *(long *)((long)&psVar1->bytes_cur + lVar3);
    *(undefined1 *)((long)&(psVar1->mtx).field_0 + lVar3 + 0x40) = 0;
    pthread_mutex_unlock((pthread_mutex_t *)((long)&(psVar1->mtx).field_0 + lVar3 + 0x48));
    lVar3 = lVar3 + 0x90;
  }
  stats->bytes = stats->bytes + lVar4;
  return;
}

Assistant:

void
sec_stats_merge(tsdn_t *tsdn, sec_t *sec, sec_stats_t *stats) {
	size_t sum = 0;
	for (size_t i = 0; i < sec->opts.nshards; i++) {
		/*
		 * We could save these lock acquisitions by making bytes_cur
		 * atomic, but stats collection is rare anyways and we expect
		 * the number and type of stats to get more interesting.
		 */
		malloc_mutex_lock(tsdn, &sec->shards[i].mtx);
		sum += sec->shards[i].bytes_cur;
		malloc_mutex_unlock(tsdn, &sec->shards[i].mtx);
	}
	stats->bytes += sum;
}